

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::recordPivots(HModel *this,int columnIn,int columnOut,double alpha)

{
  int local_18;
  int local_14;
  double local_10;
  
  if (-1 < columnIn) {
    this->numberIteration = this->numberIteration + 1;
  }
  local_18 = columnOut;
  local_14 = columnIn;
  local_10 = alpha;
  std::vector<int,_std::allocator<int>_>::push_back(&this->historyColumnIn,&local_14);
  std::vector<int,_std::allocator<int>_>::push_back(&this->historyColumnOut,&local_18);
  std::vector<double,_std::allocator<double>_>::push_back(&this->historyAlpha,&local_10);
  return;
}

Assistant:

void HModel::recordPivots(int columnIn, int columnOut, double alpha) {
    if (columnIn >= 0) numberIteration++;
#ifdef JAJH_dev
    historyColumnIn.push_back(columnIn);
    historyColumnOut.push_back(columnOut);
    historyAlpha.push_back(alpha);
#endif
}